

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CATNLoader.hpp
# Opt level: O3

Grammar<unsigned_char> *
LoadGrammar<unsigned_char>(Grammar<unsigned_char> *__return_storage_ptr__,char *filename)

{
  int iVar1;
  undefined4 extraout_var;
  
  (__return_storage_ptr__->super_IGrammar)._vptr_IGrammar = (_func_int **)&PTR__Grammar_001c54a8;
  (__return_storage_ptr__->m_networks)._M_h._M_buckets =
       &(__return_storage_ptr__->m_networks)._M_h._M_single_bucket;
  (__return_storage_ptr__->m_networks)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->m_networks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->m_networks)._M_h._M_element_count = 0;
  (__return_storage_ptr__->m_networks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->m_networks)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->m_networks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__return_storage_ptr__->m_identifiers).
  super__Vector_base<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_identifiers).
  super__Vector_base<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_identifiers).
  super__Vector_base<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->m_root_id)._vptr_Identifier = (_func_int **)&PTR__Identifier_001c4d18;
  (__return_storage_ptr__->m_root_id).m_id._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_root_id).m_id.field_2;
  (__return_storage_ptr__->m_root_id).m_id._M_string_length = 0;
  (__return_storage_ptr__->m_root_id).m_id.field_2._M_local_buf[0] = L'\0';
  (__return_storage_ptr__->m_grammar_name)._vptr_Identifier =
       (_func_int **)&PTR__Identifier_001c4d18;
  (__return_storage_ptr__->m_grammar_name).m_id._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_grammar_name).m_id.field_2;
  (__return_storage_ptr__->m_grammar_name).m_id._M_string_length = 0;
  (__return_storage_ptr__->m_grammar_name).m_id.field_2._M_local_buf[0] = L'\0';
  (__return_storage_ptr__->m_options).
  super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ._M_h._M_buckets =
       &(__return_storage_ptr__->m_options).
        super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
        ._M_h._M_single_bucket;
  (__return_storage_ptr__->m_options).
  super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->m_options).
  super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->m_options).
  super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ._M_h._M_element_count = 0;
  (__return_storage_ptr__->m_options).
  super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->m_options).
  super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->m_options).
  super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__return_storage_ptr__->m_options)._vptr_GrammarOptions =
       (_func_int **)&PTR__GrammarOptions_001c4d48;
  iVar1 = Centaurus::Grammar<unsigned_char>::parse
                    (__return_storage_ptr__,"../../grammar/json2.cgr",1);
  return (Grammar<unsigned_char> *)CONCAT44(extraout_var,iVar1);
}

Assistant:

static Centaurus::Grammar<TCHAR> LoadGrammar(const char *filename)
{
    using namespace Microsoft::VisualStudio::CppUnitTestFramework;

    Centaurus::Grammar<TCHAR> grammar;

    try
    {
        grammar.parse(filename);
    }
    catch (const std::exception& ex)
    {
        Assert::Fail(L"ATN construction failed.");
    }

    return grammar;
}